

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<_drmModeModeInfo>::relocate
          (QArrayDataPointer<_drmModeModeInfo> *this,qsizetype offset,_drmModeModeInfo **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<_drmModeModeInfo> *in_RDI;
  _drmModeModeInfo **unaff_retaddr;
  _drmModeModeInfo *res;
  _drmModeModeInfo *first;
  QArrayDataPointer<_drmModeModeInfo> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<_drmModeModeInfo,long_long>
            (first,(longlong)in_RDI,(_drmModeModeInfo *)0x132f14);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<_drmModeModeInfo>,_drmModeModeInfo_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x44 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }